

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeChangeEncoding(Mem *pMem,int desiredEnc)

{
  byte bVar1;
  byte bVar2;
  undefined2 uVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  ulong uVar7;
  ushort *puVar8;
  byte *pbVar9;
  ushort *puVar10;
  byte *pbVar11;
  uint uVar12;
  byte *pbVar13;
  long lVar14;
  ushort *puVar15;
  uint uVar16;
  int iVar17;
  
  iVar17 = 0;
  if ((pMem->flags & 2) != 0) {
    iVar17 = 0;
    if ((uint)pMem->enc != desiredEnc) {
      if (desiredEnc == 1 || pMem->enc == 1) {
        uVar16 = pMem->n;
        if (desiredEnc == 1) {
          uVar16 = uVar16 & 0xfffffffe;
          pMem->n = uVar16;
          iVar6 = uVar16 * 2 + 1;
        }
        else {
          iVar6 = uVar16 * 2 + 2;
        }
        puVar10 = (ushort *)pMem->z;
        pbVar9 = (byte *)sqlite3DbMallocRaw(pMem->db,iVar6);
        if (pbVar9 == (byte *)0x0) {
          iVar17 = 7;
        }
        else {
          puVar8 = (ushort *)((long)(int)uVar16 + (long)puVar10);
          if (pMem->enc == '\x01') {
            pbVar11 = pbVar9;
            if (desiredEnc == 2) {
              if (0 < (int)uVar16) {
                do {
                  bVar2 = (byte)*puVar10;
                  puVar15 = (ushort *)((long)puVar10 + 1);
                  puVar10 = puVar15;
                  uVar16 = (uint)bVar2;
                  if (bVar2 < 0xc0) {
LAB_0013723d:
                    *(short *)pbVar11 = (short)uVar16;
                    pbVar11 = pbVar11 + 2;
                  }
                  else {
                    uVar12 = (uint)""[bVar2 - 0xc0];
                    while ((puVar10 = puVar8, puVar15 != puVar8 &&
                           (uVar5 = *puVar15, puVar10 = puVar15, ((byte)uVar5 & 0xffffffc0) == 0x80)
                           )) {
                      puVar15 = (ushort *)((long)puVar15 + 1);
                      uVar12 = (byte)uVar5 & 0x3f | uVar12 << 6;
                    }
                    uVar16 = 0xfffd;
                    if ((((uVar12 & 0xfffffffe) == 0xfffe) || (uVar12 < 0x80)) ||
                       (((uVar12 & 0xfffff800) == 0xd800 || (uVar16 = uVar12, uVar12 < 0x10000))))
                    goto LAB_0013723d;
                    *pbVar11 = (byte)(uVar12 - 0x10000 >> 10) & 0xc0 | (byte)(uVar12 >> 10) & 0x3f;
                    pbVar11[1] = (byte)(uVar12 - 0x10000 >> 0x12) & 3 | 0xd8;
                    pbVar11[2] = (byte)uVar12;
                    pbVar11[3] = (byte)(uVar12 >> 8) & 3 | 0xdc;
                    pbVar11 = pbVar11 + 4;
                  }
                } while (puVar10 < puVar8);
              }
            }
            else if (0 < (int)uVar16) {
              do {
                bVar2 = (byte)*puVar10;
                puVar15 = (ushort *)((long)puVar10 + 1);
                puVar10 = puVar15;
                uVar16 = (uint)bVar2;
                if (bVar2 < 0xc0) {
LAB_00137466:
                  uVar12 = uVar16;
                  pbVar13 = pbVar11 + 1;
                  *pbVar11 = (byte)(uVar12 >> 8);
                  lVar14 = 2;
                }
                else {
                  uVar12 = (uint)""[bVar2 - 0xc0];
                  while ((puVar10 = puVar8, puVar15 != puVar8 &&
                         (uVar5 = *puVar15, puVar10 = puVar15, ((byte)uVar5 & 0xffffffc0) == 0x80)))
                  {
                    puVar15 = (ushort *)((long)puVar15 + 1);
                    uVar12 = (byte)uVar5 & 0x3f | uVar12 << 6;
                  }
                  uVar16 = 0xfffd;
                  if (((((uVar12 & 0xfffffffe) == 0xfffe) || (uVar12 < 0x80)) ||
                      ((uVar12 & 0xfffff800) == 0xd800)) || (uVar16 = uVar12, uVar12 < 0x10000))
                  goto LAB_00137466;
                  *pbVar11 = (byte)(uVar12 - 0x10000 >> 0x12) & 3 | 0xd8;
                  pbVar11[1] = (byte)(uVar12 - 0x10000 >> 10) & 0xc0 | (byte)(uVar12 >> 10) & 0x3f;
                  pbVar13 = pbVar11 + 3;
                  pbVar11[2] = (byte)(uVar12 >> 8) & 3 | 0xdc;
                  lVar14 = 4;
                }
                pbVar11 = pbVar11 + lVar14;
                *pbVar13 = (byte)uVar12;
              } while (puVar10 < puVar8);
            }
            pMem->n = (int)pbVar11 - (int)pbVar9;
            *pbVar11 = 0;
            pbVar11 = pbVar11 + 1;
          }
          else {
            pbVar11 = pbVar9;
            if (pMem->enc == '\x02') {
              if (0 < (int)uVar16) {
                do {
                  bVar2 = (byte)*puVar10;
                  puVar15 = puVar10 + 1;
                  bVar1 = *(byte *)((long)puVar10 + 1);
                  uVar5 = *puVar10;
                  if (((bVar1 & 0xf8) == 0xd8) && (puVar15 < puVar8)) {
                    uVar4 = puVar10[1];
                    bVar1 = *(byte *)((long)puVar10 + 3);
                    puVar15 = puVar10 + 2;
                    iVar6 = (uVar5 & 0x3c0) * 0x400;
                    *pbVar11 = (byte)(iVar6 + 0x10000U >> 0x12) | 0xf0;
                    pbVar11[1] = (byte)(iVar6 + ((uint)bVar2 << 10 & 0xf000) + 0x10000 >> 0xc) &
                                 0x3f | 0x80;
                    pbVar11[2] = (byte)(((bVar1 & 3) << 8 | (uint)(byte)uVar4 | (uint)bVar2 << 10)
                                       >> 6) & 0x3f | 0x80;
                    pbVar11[3] = (byte)uVar4 & 0x3f | 0x80;
                    pbVar11 = pbVar11 + 4;
                  }
                  else if (uVar5 < 0x80) {
                    *pbVar11 = bVar2;
                    pbVar11 = pbVar11 + 1;
                  }
                  else if (bVar1 < 8) {
                    *pbVar11 = (byte)(uVar5 >> 6) | 0xc0;
                    pbVar11[1] = bVar2 & 0x3f | 0x80;
                    pbVar11 = pbVar11 + 2;
                  }
                  else {
                    *pbVar11 = bVar1 >> 4 | 0xe0;
                    pbVar11[1] = (byte)(uVar5 >> 6) & 0x3f | 0x80;
                    pbVar11[2] = bVar2 & 0x3f | 0x80;
                    pbVar11 = pbVar11 + 3;
                  }
                  puVar10 = puVar15;
                } while (puVar15 < puVar8);
              }
            }
            else if (0 < (int)uVar16) {
              do {
                bVar2 = (byte)*puVar10;
                puVar15 = puVar10 + 1;
                bVar1 = *(byte *)((long)puVar10 + 1);
                uVar5 = CONCAT11(bVar2,bVar1);
                if (((bVar2 & 0xf8) == 0xd8) && (puVar15 < puVar8)) {
                  uVar4 = puVar10[1];
                  bVar2 = *(byte *)((long)puVar10 + 3);
                  puVar15 = puVar10 + 2;
                  iVar6 = (uVar5 & 0x3c0) * 0x400;
                  *pbVar11 = (byte)(iVar6 + 0x10000U >> 0x12) | 0xf0;
                  pbVar11[1] = (byte)(iVar6 + ((uint)bVar1 << 10 & 0xf000) + 0x10000 >> 0xc) & 0x3f
                               | 0x80;
                  pbVar11[2] = (byte)((((byte)uVar4 & 3) << 8 | (uint)bVar2 | (uint)bVar1 << 10) >>
                                     6) & 0x3f | 0x80;
                  pbVar11[3] = bVar2 & 0x3f | 0x80;
                  pbVar11 = pbVar11 + 4;
                }
                else if (uVar5 < 0x80) {
                  *pbVar11 = bVar1;
                  pbVar11 = pbVar11 + 1;
                }
                else if (bVar2 < 8) {
                  *pbVar11 = (byte)(uVar5 >> 6) | 0xc0;
                  pbVar11[1] = bVar1 & 0x3f | 0x80;
                  pbVar11 = pbVar11 + 2;
                }
                else {
                  *pbVar11 = bVar2 >> 4 | 0xe0;
                  pbVar11[1] = (byte)(uVar5 >> 6) & 0x3f | 0x80;
                  pbVar11[2] = bVar1 & 0x3f | 0x80;
                  pbVar11 = pbVar11 + 3;
                }
                puVar10 = puVar15;
              } while (puVar15 < puVar8);
            }
            pMem->n = (int)pbVar11 - (int)pbVar9;
          }
          *pbVar11 = 0;
          sqlite3VdbeMemRelease(pMem);
          uVar3 = pMem->flags;
          pMem->enc = (u8)desiredEnc;
          pMem->flags = uVar3 & 0xe1ff | 0x600;
          pMem->z = (char *)pbVar9;
          pMem->zMalloc = (char *)pbVar9;
        }
      }
      else {
        iVar6 = sqlite3VdbeMemMakeWriteable(pMem);
        iVar17 = 7;
        if (iVar6 == 0) {
          uVar7 = (long)pMem->n & 0xfffffffffffffffe;
          if (0 < (int)uVar7) {
            puVar10 = (ushort *)pMem->z;
            puVar8 = (ushort *)(uVar7 + (long)puVar10);
            do {
              *puVar10 = *puVar10 << 8 | *puVar10 >> 8;
              puVar10 = puVar10 + 1;
            } while (puVar10 < puVar8);
          }
          pMem->enc = (u8)desiredEnc;
          iVar17 = 0;
        }
      }
    }
  }
  return iVar17;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeChangeEncoding(Mem *pMem, int desiredEnc){
#ifndef SQLITE_OMIT_UTF16
  int rc;
#endif
  assert( (pMem->flags&MEM_RowSet)==0 );
  assert( desiredEnc==SQLITE_UTF8 || desiredEnc==SQLITE_UTF16LE
           || desiredEnc==SQLITE_UTF16BE );
  if( !(pMem->flags&MEM_Str) || pMem->enc==desiredEnc ){
    return SQLITE_OK;
  }
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
#ifdef SQLITE_OMIT_UTF16
  return SQLITE_ERROR;
#else

  /* MemTranslate() may return SQLITE_OK or SQLITE_NOMEM. If NOMEM is returned,
  ** then the encoding of the value may not have changed.
  */
  rc = sqlite3VdbeMemTranslate(pMem, (u8)desiredEnc);
  assert(rc==SQLITE_OK    || rc==SQLITE_NOMEM);
  assert(rc==SQLITE_OK    || pMem->enc!=desiredEnc);
  assert(rc==SQLITE_NOMEM || pMem->enc==desiredEnc);
  return rc;
#endif
}